

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

SDL12_TimerID SDL_AddTimer(Uint32 interval,SDL12_NewTimerCallback callback,void *param)

{
  SDL_TimerID SVar1;
  SDL12_TimerID_Data *pSVar2;
  
  pSVar2 = (SDL12_TimerID_Data *)(*SDL20_malloc)(0x28);
  if (pSVar2 == (SDL12_TimerID_Data *)0x0) {
    pSVar2 = (SDL12_TimerID_Data *)0x0;
    (*SDL20_Error)(SDL_ENOMEM);
  }
  else {
    pSVar2->callback = callback;
    pSVar2->param = param;
    SVar1 = (*SDL20_AddTimer)(((interval + 9) / 10) * 10,AddTimerCallback12,pSVar2);
    pSVar2->timer_id = SVar1;
    if (SVar1 == 0) {
      (*SDL20_free)(pSVar2);
      pSVar2 = (SDL12_TimerID_Data *)0x0;
    }
    else {
      if (EventQueueMutex != (SDL_mutex *)0x0) {
        (*SDL20_LockMutex)(EventQueueMutex);
      }
      pSVar2->prev = (SDL12_TimerID_Data *)0x0;
      pSVar2->next = AddedTimers;
      if (AddedTimers != (SDL12_TimerID)0x0) {
        AddedTimers->prev = pSVar2;
      }
      AddedTimers = pSVar2;
      if (EventQueueMutex != (SDL_mutex *)0x0) {
        (*SDL20_UnlockMutex)(EventQueueMutex);
      }
    }
  }
  return pSVar2;
}

Assistant:

SDLCALL
SDL_AddTimer(Uint32 interval, SDL12_NewTimerCallback callback, void *param)
{
    SDL12_TimerID data = (SDL12_TimerID) SDL20_malloc(sizeof (SDL12_TimerID_Data));
    if (!data) {
        SDL20_OutOfMemory();
        return NULL;
    }

    interval = RoundTimerTo12Resolution(interval);
    data->callback = callback;
    data->param = param;
    data->timer_id = SDL20_AddTimer(interval, AddTimerCallback12, data);

    if (!data->timer_id) {
        SDL20_free(data);
        return NULL;
    }

    if (EventQueueMutex) {
        SDL20_LockMutex(EventQueueMutex);
    }

    data->prev = NULL;
    data->next = AddedTimers;
    if (AddedTimers) {
        AddedTimers->prev = data;
    }
    AddedTimers = data;

    if (EventQueueMutex) {
        SDL20_UnlockMutex(EventQueueMutex);
    }

    return data;
}